

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

void __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreEarlyFragmentTestsTest::prepareProgramDetails
          (ImageLoadStoreEarlyFragmentTestsTest *this,char *fragment_shader_code,
          char *geometry_shader_code,char *vertex_shader_code,programDetails *out_program_details)

{
  GLuint program;
  GLint GVar1;
  GLenum GVar2;
  GLint GVar3;
  InternalError *this_00;
  CallLogWrapper *this_01;
  bool is_program_built;
  bool local_29;
  
  local_29 = true;
  program = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n}\n\n"
                       ,(char *)0x0,(char *)0x0,
                       "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nuniform float u_depth;\n\nvoid main()\n{\n    // Left-bottom\n    gl_Position = vec4(-1, -1, u_depth, 1);\n    EmitVertex();\n\n    // Left-top\n    gl_Position = vec4(-1,  1, u_depth, 1);\n    EmitVertex();\n\n    // Right-bottom\n    gl_Position = vec4( 1, -1, u_depth, 1);\n    EmitVertex();\n\n    // Right-top\n    gl_Position = vec4( 1,  1, u_depth, 1);\n    EmitVertex();\n}\n\n"
                       ,fragment_shader_code,&local_29);
  if (local_29 == false) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"Failed to build program",::glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
               ,0x279b);
  }
  else {
    this_01 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_01,program,"u_depth");
    GVar2 = glu::CallLogWrapper::glGetError(this_01);
    glu::checkError(GVar2,"GetUniformLocation",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x27a0);
    if (GVar1 == -1) {
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_00,"Uniform is not active","u_image",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                 ,0x27a4);
    }
    else {
      GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_01,program,"u_image");
      GVar2 = glu::CallLogWrapper::glGetError(this_01);
      glu::checkError(GVar2,"GetUniformLocation",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x27a9);
      if (GVar3 != -1) {
        *(GLint *)geometry_shader_code = GVar1;
        *(GLint *)(geometry_shader_code + 4) = GVar3;
        *(GLuint *)(geometry_shader_code + 8) = program;
        return;
      }
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_00,"Uniform is not active","u_image",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                 ,0x27ad);
    }
  }
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void prepareProgramDetails(const char* fragment_shader_code, const char* geometry_shader_code,
							   const char* vertex_shader_code, programDetails& out_program_details)
	{
		static const char* const depth_uniform_name = "u_depth";
		static const char* const image_uniform_name = "u_image";
		bool					 is_program_built   = true;

		GLuint program_id = BuildProgram(vertex_shader_code, 0 /* src_tcs */, 0 /* src_tes */, geometry_shader_code,
										 fragment_shader_code, &is_program_built);

		if (false == is_program_built)
		{
			throw tcu::InternalError("Failed to build program", "", __FILE__, __LINE__);
		}

		/* Get depth uniform location */
		GLint depth_uniform_location = glGetUniformLocation(program_id, depth_uniform_name);
		GLU_EXPECT_NO_ERROR(glGetError(), "GetUniformLocation");

		if (m_invalid_uniform_location == depth_uniform_location)
		{
			throw tcu::InternalError("Uniform is not active", image_uniform_name, __FILE__, __LINE__);
		}

		/* Get image uniform location */
		GLint image_uniform_location = glGetUniformLocation(program_id, image_uniform_name);
		GLU_EXPECT_NO_ERROR(glGetError(), "GetUniformLocation");

		if (m_invalid_uniform_location == image_uniform_location)
		{
			throw tcu::InternalError("Uniform is not active", image_uniform_name, __FILE__, __LINE__);
		}

		/* Store results */
		out_program_details.m_depth_uniform_location = depth_uniform_location;
		out_program_details.m_image_uniform_location = image_uniform_location;
		out_program_details.m_program_id			 = program_id;
	}